

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O2

SPxId __thiscall
soplex::SPxDefaultRT<double>::selectEnter
          (SPxDefaultRT<double> *this,double *max,int param_2,bool param_3)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  double *pdVar11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  DataKey DVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  undefined4 in_register_00000014;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  uint local_c4;
  double local_c0;
  uint local_a8;
  DataKey local_a0;
  SPxId enterId;
  
  iVar9 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])
                    (this,max,CONCAT44(in_register_00000014,param_2));
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)(*(long *)(CONCAT44(extraout_var,iVar9) + 0x6b8) + 0x20));
  iVar9 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)(*(long *)(CONCAT44(extraout_var_00,iVar9) + 0x6c0) + 0x20));
  iVar9 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar13 = **(long **)(CONCAT44(extraout_var_01,iVar9) + 0x6c0);
  iVar9 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar2 = *(long *)(*(long *)(CONCAT44(extraout_var_02,iVar9) + 0x6c0) + 0x40);
  iVar9 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar14 = *(long *)(CONCAT44(extraout_var_03,iVar9) + 0x6c0);
  iVar9 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar16 = **(long **)(CONCAT44(extraout_var_04,iVar9) + 0x6e0);
  iVar9 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar3 = **(long **)(CONCAT44(extraout_var_05,iVar9) + 0x6d8);
  iVar9 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar4 = **(long **)(CONCAT44(extraout_var_06,iVar9) + 0x6b8);
  iVar9 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar5 = *(long *)(*(long *)(CONCAT44(extraout_var_07,iVar9) + 0x6b8) + 0x40);
  iVar9 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar6 = *(long *)(CONCAT44(extraout_var_08,iVar9) + 0x6b8);
  iVar9 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar18 = **(long **)(CONCAT44(extraout_var_09,iVar9) + 0x6f0);
  iVar9 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar7 = **(long **)(CONCAT44(extraout_var_10,iVar9) + 0x6e8);
  iVar9 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  dVar20 = SPxSolverBase<double>::epsilon((SPxSolverBase<double> *)CONCAT44(extraout_var_11,iVar9));
  local_c0 = *max;
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  dVar21 = -dVar20;
  local_c4 = 0xffffffff;
  if (local_c0 <= 0.0) {
    local_a0.info = 0;
    local_a0.idx = 0;
    for (lVar17 = 0; lVar17 < *(int *)(lVar14 + 0x28); lVar17 = lVar17 + 1) {
      iVar9 = *(int *)(*(long *)(lVar14 + 0x30) + lVar17 * 4);
      lVar19 = (long)iVar9;
      dVar1 = *(double *)(lVar2 + lVar19 * 8);
      if (dVar1 <= dVar20) {
        if ((dVar1 < dVar21) &&
           (dVar22 = *(double *)(lVar3 + lVar19 * 8), pdVar11 = (double *)infinity(),
           dVar22 < *pdVar11)) {
          dVar22 = (*(double *)(lVar3 + lVar19 * 8) - *(double *)(lVar13 + lVar19 * 8)) +
                   (this->super_SPxRatioTester<double>).delta;
          goto joined_r0x001d0133;
        }
      }
      else {
        dVar22 = *(double *)(lVar16 + lVar19 * 8);
        pdVar11 = (double *)infinity();
        if (-*pdVar11 < dVar22) {
          dVar22 = (*(double *)(lVar16 + lVar19 * 8) - *(double *)(lVar13 + lVar19 * 8)) -
                   (this->super_SPxRatioTester<double>).delta;
joined_r0x001d0133:
          if (local_c0 < dVar22 / dVar1) {
            iVar10 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
            local_a0 = (DataKey)SPxSolverBase<double>::id
                                          ((SPxSolverBase<double> *)CONCAT44(extraout_var_14,iVar10)
                                           ,iVar9);
            local_c4 = (uint)lVar17;
            local_c0 = dVar22 / dVar1;
            enterId.super_DataKey = local_a0;
          }
        }
      }
    }
    local_a8 = 0xffffffff;
    for (lVar17 = 0; lVar17 < *(int *)(lVar6 + 0x28); lVar17 = lVar17 + 1) {
      iVar9 = *(int *)(*(long *)(lVar6 + 0x30) + lVar17 * 4);
      lVar19 = (long)iVar9;
      dVar1 = *(double *)(lVar5 + lVar19 * 8);
      if (dVar1 <= dVar20) {
        if ((dVar1 < dVar21) &&
           (dVar22 = *(double *)(lVar7 + lVar19 * 8), pdVar11 = (double *)infinity(),
           dVar22 < *pdVar11)) {
          dVar22 = (*(double *)(lVar7 + lVar19 * 8) - *(double *)(lVar4 + lVar19 * 8)) +
                   (this->super_SPxRatioTester<double>).delta;
          goto LAB_001d02aa;
        }
      }
      else {
        dVar22 = *(double *)(lVar18 + lVar19 * 8);
        pdVar11 = (double *)infinity();
        if (-*pdVar11 < dVar22) {
          dVar22 = (*(double *)(lVar18 + lVar19 * 8) - *(double *)(lVar4 + lVar19 * 8)) -
                   (this->super_SPxRatioTester<double>).delta;
LAB_001d02aa:
          if (local_c0 < dVar22 / dVar1) {
            iVar10 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
            local_a0 = (DataKey)SPxSolverBase<double>::coId
                                          ((SPxSolverBase<double> *)CONCAT44(extraout_var_15,iVar10)
                                           ,iVar9);
            local_a8 = (uint)lVar17;
            local_c0 = dVar22 / dVar1;
            enterId.super_DataKey = local_a0;
          }
        }
      }
    }
    if ((int)local_a8 < 0) {
      if ((int)local_c4 < 0) goto LAB_001d03c6;
      lVar14 = (long)*(int *)(*(long *)(lVar14 + 0x30) + (ulong)local_c4 * 4);
      local_c0 = *(double *)(lVar2 + lVar14 * 8);
      bVar8 = dVar20 < local_c0;
      goto LAB_001d03a3;
    }
    lVar13 = (long)*(int *)(*(long *)(lVar6 + 0x30) + (ulong)local_a8 * 4);
    local_c0 = *(double *)(lVar5 + lVar13 * 8);
    bVar8 = dVar20 < local_c0;
LAB_001d0335:
    if (!bVar8 && local_c0 != dVar20) {
      lVar18 = lVar7;
    }
    pdVar11 = (double *)(lVar18 + lVar13 * 8);
    pdVar15 = (double *)(lVar4 + lVar13 * 8);
  }
  else {
    local_a0.info = 0;
    local_a0.idx = 0;
    for (lVar17 = 0; lVar17 < *(int *)(lVar14 + 0x28); lVar17 = lVar17 + 1) {
      iVar9 = *(int *)(*(long *)(lVar14 + 0x30) + lVar17 * 4);
      lVar19 = (long)iVar9;
      dVar1 = *(double *)(lVar2 + lVar19 * 8);
      if (dVar1 <= dVar20) {
        if ((dVar1 < dVar21) &&
           (dVar22 = *(double *)(lVar16 + lVar19 * 8), pdVar11 = (double *)infinity(),
           -*pdVar11 < dVar22)) {
          dVar22 = (*(double *)(lVar16 + lVar19 * 8) - *(double *)(lVar13 + lVar19 * 8)) -
                   (this->super_SPxRatioTester<double>).delta;
          goto joined_r0x001cfdf1;
        }
      }
      else {
        dVar22 = *(double *)(lVar3 + lVar19 * 8);
        pdVar11 = (double *)infinity();
        if (dVar22 < *pdVar11) {
          dVar22 = (*(double *)(lVar3 + lVar19 * 8) - *(double *)(lVar13 + lVar19 * 8)) +
                   (this->super_SPxRatioTester<double>).delta;
joined_r0x001cfdf1:
          if (dVar22 / dVar1 < local_c0) {
            iVar10 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
            local_a0 = (DataKey)SPxSolverBase<double>::id
                                          ((SPxSolverBase<double> *)CONCAT44(extraout_var_12,iVar10)
                                           ,iVar9);
            local_c4 = (uint)lVar17;
            local_c0 = dVar22 / dVar1;
            enterId.super_DataKey = local_a0;
          }
        }
      }
    }
    local_a8 = 0xffffffff;
    for (lVar17 = 0; lVar17 < *(int *)(lVar6 + 0x28); lVar17 = lVar17 + 1) {
      iVar9 = *(int *)(*(long *)(lVar6 + 0x30) + lVar17 * 4);
      lVar19 = (long)iVar9;
      dVar1 = *(double *)(lVar5 + lVar19 * 8);
      if (dVar1 <= dVar20) {
        if ((dVar1 < dVar21) &&
           (dVar22 = *(double *)(lVar18 + lVar19 * 8), pdVar11 = (double *)infinity(),
           -*pdVar11 < dVar22)) {
          dVar22 = (*(double *)(lVar18 + lVar19 * 8) - *(double *)(lVar4 + lVar19 * 8)) -
                   (this->super_SPxRatioTester<double>).delta;
          goto LAB_001cff77;
        }
      }
      else {
        dVar22 = *(double *)(lVar7 + lVar19 * 8);
        pdVar11 = (double *)infinity();
        if (dVar22 < *pdVar11) {
          dVar22 = (*(double *)(lVar7 + lVar19 * 8) - *(double *)(lVar4 + lVar19 * 8)) +
                   (this->super_SPxRatioTester<double>).delta;
LAB_001cff77:
          if (dVar22 / dVar1 < local_c0) {
            iVar10 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
            local_a0 = (DataKey)SPxSolverBase<double>::coId
                                          ((SPxSolverBase<double> *)CONCAT44(extraout_var_13,iVar10)
                                           ,iVar9);
            local_a8 = (uint)lVar17;
            local_c0 = dVar22 / dVar1;
            enterId.super_DataKey = local_a0;
          }
        }
      }
    }
    if (-1 < (int)local_a8) {
      lVar13 = (long)*(int *)(*(long *)(lVar6 + 0x30) + (ulong)local_a8 * 4);
      local_c0 = *(double *)(lVar5 + lVar13 * 8);
      bVar8 = local_c0 < dVar20;
      goto LAB_001d0335;
    }
    if ((int)local_c4 < 0) goto LAB_001d03c6;
    lVar14 = (long)*(int *)(*(long *)(lVar14 + 0x30) + (ulong)local_c4 * 4);
    local_c0 = *(double *)(lVar2 + lVar14 * 8);
    bVar8 = local_c0 < dVar20;
LAB_001d03a3:
    if (!bVar8 && local_c0 != dVar20) {
      lVar16 = lVar3;
    }
    pdVar11 = (double *)(lVar16 + lVar14 * 8);
    pdVar15 = (double *)(lVar13 + lVar14 * 8);
  }
  local_c0 = (*pdVar11 - *pdVar15) / local_c0;
LAB_001d03c6:
  if (local_a0.info != 0) {
    iVar9 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
    bVar8 = SPxSolverBase<double>::isBasic
                      ((SPxSolverBase<double> *)CONCAT44(extraout_var_16,iVar9),&enterId);
    if (bVar8) {
      lVar13 = 0x6b8;
      if ((-1 < (int)local_a8) || (lVar13 = 0x6c0, local_a8 = local_c4, -1 < (int)local_c4)) {
        iVar9 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
        SSVectorBase<double>::clearNum
                  ((SSVectorBase<double> *)
                   (*(long *)(CONCAT44(extraout_var_17,iVar9) + lVar13) + 0x20),local_a8);
      }
      DVar12 = (DataKey)selectEnter(this,max,0,false);
      return (SPxId)DVar12;
    }
  }
  *max = local_c0;
  return (SPxId)enterId.super_DataKey;
}

Assistant:

SPxId SPxDefaultRT<R>::selectEnter(R& max, int, bool)
{
   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   const R*   pvec = this->solver()->pVec().get_const_ptr();
   const R*   pupd = this->solver()->pVec().delta().values();
   const IdxSet& pidx = this->solver()->pVec().idx();
   const R*   lpb  = this->solver()->lpBound().get_const_ptr();
   const R*   upb  = this->solver()->upBound().get_const_ptr();

   const R*   cvec = this->solver()->coPvec().get_const_ptr();
   const R*   cupd = this->solver()->coPvec().delta().values();
   const IdxSet& cidx = this->solver()->coPvec().idx();
   const R*   lcb  = this->solver()->lcBound().get_const_ptr();
   const R*   ucb  = this->solver()->ucBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   R val     = max;
   int  pnum    = -1;
   int  cnum    = -1;

   SPxId enterId;
   int   i;
   int   j;
   R  x;

   // PARALLEL the j loops could be parallelized
   if(val > 0)
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x > epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x > epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }
   else
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x < epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x < epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }

   if(enterId.isValid() && this->solver()->isBasic(enterId))
   {
      SPxOut::debug(this, "DDEFRT01 isValid() && isBasic(): max={}\n", max);

      if(cnum >= 0)
         this->solver()->coPvec().delta().clearNum(cnum);
      else if(pnum >= 0)
         this->solver()->pVec().delta().clearNum(pnum);

      return SPxDefaultRT<R>::selectEnter(max, 0, false);
   }

   SPX_DEBUG(

      if(!enterId.isValid())
      std::cout << "DDEFRT02 !isValid(): max=" << max << ", x=" << x << std::endl;
   )
      max = val;

   return enterId;
}